

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O3

cf_void_t cf_memchk_init(void)

{
  g_memchk_ctx.alloc_info = (cf_hashtbl_t *)0x0;
  g_memchk_ctx.mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  g_memchk_ctx.alloc_size = 0;
  g_memchk_ctx.mutex._16_8_ = 0;
  g_memchk_ctx.mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  g_memchk_ctx.mutex.__align = 0;
  g_memchk_ctx.mutex._8_8_ = 0;
  g_memchk_ctx.inited = 1;
  g_memchk_ctx._4_4_ = 0;
  g_memchk_ctx.alloc_info = cf_hashtbl_new(0x20,(cf_hashtbl_cb_f)0x0);
  cf_mutex_init(&g_memchk_ctx.mutex,(cf_mutex_attr_t *)0x0);
  return;
}

Assistant:

cf_void_t cf_memchk_init() {
#ifdef CF_MEMORY_DBG
    cf_membzero(&g_memchk_ctx, sizeof(g_memchk_ctx));
    g_memchk_ctx.inited = CF_TRUE;
    g_memchk_ctx.alloc_info = cf_hashtbl_new(32, CF_NULL_PTR);
    cf_mutex_init(&g_memchk_ctx.mutex, CF_NULL_PTR);
#endif
}